

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

void __thiscall FStringData::Dealloc(FStringData *this)

{
  if (0 < this->RefCount) {
    __assert_fail("RefCount <= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/zstring.cpp"
                  ,0x4c2,"void FStringData::Dealloc()");
  }
  free(this);
  return;
}

Assistant:

void FStringData::Dealloc ()
{
	assert (RefCount <= 0);

#ifdef _WIN32
	HeapFree (StringHeap, 0, this);
#else
	free (this);
#endif
}